

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int mod_mul_consttime(BIGNUM *r,BIGNUM *a,BIGNUM *b,BN_MONT_CTX *mont,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a_00;
  uint uVar2;
  
  BN_CTX_start((BN_CTX *)ctx);
  a_00 = BN_CTX_get((BN_CTX *)ctx);
  uVar2 = 0;
  if (a_00 != (BIGNUM *)0x0) {
    iVar1 = BN_to_montgomery((BIGNUM *)a_00,a,mont,ctx);
    if (iVar1 != 0) {
      iVar1 = BN_mod_mul_montgomery((BIGNUM *)r,a_00,(BIGNUM *)b,(BN_MONT_CTX *)mont,(BN_CTX *)ctx);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  BN_CTX_end((BN_CTX *)ctx);
  return uVar2;
}

Assistant:

static int mod_mul_consttime(BIGNUM *r, const BIGNUM *a, const BIGNUM *b,
                             const BN_MONT_CTX *mont, BN_CTX *ctx) {
  bssl::BN_CTXScope scope(ctx);
  BIGNUM *tmp = BN_CTX_get(ctx);
  // |BN_mod_mul_montgomery| removes a factor of R, so we cancel it with a
  // single |BN_to_montgomery| which adds one factor of R.
  return tmp != nullptr &&  //
         BN_to_montgomery(tmp, a, mont, ctx) &&
         BN_mod_mul_montgomery(r, tmp, b, mont, ctx);
}